

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O3

void __thiscall
Diligent::DynamicDescriptorSetAllocator::ReleasePools
          (DynamicDescriptorSetAllocator *this,Uint64 QueueMask)

{
  ulong uVar1;
  pointer Pool_00;
  DescriptorPoolWrapper *Pool;
  pointer pVVar2;
  pointer pVVar3;
  
  Pool_00 = (this->m_AllocatedPools).
            super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (this->m_AllocatedPools).
           super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pVVar2 = Pool_00;
  if (Pool_00 != pVVar3) {
    do {
      DescriptorPoolManager::DisposePool(this->m_GlobalPoolMgr,Pool_00,QueueMask);
      Pool_00 = Pool_00 + 1;
    } while (Pool_00 != pVVar3);
    Pool_00 = (this->m_AllocatedPools).
              super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pVVar2 = (this->m_AllocatedPools).
             super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  uVar1 = ((long)Pool_00 - (long)pVVar2 >> 3) * -0x5555555555555555;
  if (uVar1 < this->m_PeakPoolCount) {
    uVar1 = this->m_PeakPoolCount;
  }
  this->m_PeakPoolCount = uVar1;
  pVVar3 = pVVar2;
  if (Pool_00 != pVVar2) {
    do {
      VulkanUtilities::
      VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>::
      ~VulkanObjectWrapper(pVVar3);
      pVVar3 = pVVar3 + 1;
    } while (pVVar3 != Pool_00);
    (this->m_AllocatedPools).
    super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar2;
  }
  return;
}

Assistant:

void DynamicDescriptorSetAllocator::ReleasePools(Uint64 QueueMask)
{
    for (VulkanUtilities::DescriptorPoolWrapper& Pool : m_AllocatedPools)
    {
        m_GlobalPoolMgr.DisposePool(std::move(Pool), QueueMask);
    }
    m_PeakPoolCount = std::max(m_PeakPoolCount, m_AllocatedPools.size());
    m_AllocatedPools.clear();
}